

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall Catch::AssertionResult::hasExpandedExpression(AssertionResult *this)

{
  size_type sVar1;
  int iVar2;
  bool bVar3;
  string local_50;
  string local_30;
  
  sVar1 = (this->m_info).capturedExpression.m_size;
  if (sVar1 != 0) {
    getExpandedExpression_abi_cxx11_(&local_50,this);
    getExpression_abi_cxx11_(&local_30,this);
    bVar3 = true;
    if (local_50._M_string_length != local_30._M_string_length) goto LAB_0011694c;
    if (local_50._M_string_length != 0) {
      iVar2 = bcmp(local_50._M_dataplus._M_p,local_30._M_dataplus._M_p,local_50._M_string_length);
      bVar3 = iVar2 != 0;
      goto LAB_0011694c;
    }
  }
  bVar3 = false;
LAB_0011694c:
  if (sVar1 != 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return bVar3;
}

Assistant:

constexpr auto empty() const noexcept -> bool {
            return m_size == 0;
        }